

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtQuantizedBvh.cpp
# Opt level: O3

char * __thiscall
cbtQuantizedBvh::serialize(cbtQuantizedBvh *this,void *dataBuffer,cbtSerializer *serializer)

{
  int iVar1;
  cbtOptimizedBvhNode *pcVar2;
  cbtQuantizedBvhNode *pcVar3;
  undefined8 uVar4;
  int i;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int *piVar9;
  int i_3;
  long lVar10;
  
  lVar5 = 0;
  do {
    *(cbtScalar *)((long)dataBuffer + lVar5 * 4 + 0x10) = (this->m_bvhAabbMax).m_floats[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  lVar5 = 0;
  do {
    *(cbtScalar *)((long)dataBuffer + lVar5 * 4) = (this->m_bvhAabbMin).m_floats[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  lVar5 = 0;
  do {
    *(cbtScalar *)((long)dataBuffer + lVar5 * 4 + 0x20) = (this->m_bvhQuantization).m_floats[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  *(int *)((long)dataBuffer + 0x30) = this->m_curNodeIndex;
  *(uint *)((long)dataBuffer + 0x34) = (uint)this->m_useQuantization;
  iVar1 = (this->m_contiguousNodes).m_size;
  *(int *)((long)dataBuffer + 0x38) = iVar1;
  if (iVar1 == 0) {
    *(undefined8 *)((long)dataBuffer + 0x40) = 0;
  }
  else {
    lVar5 = (**(code **)(*(long *)serializer + 0x38))(serializer,(this->m_contiguousNodes).m_data);
    *(long *)((long)dataBuffer + 0x40) = lVar5;
    if (lVar5 != 0) {
      iVar1 = (this->m_contiguousNodes).m_size;
      lVar5 = (**(code **)(*(long *)serializer + 0x20))(serializer,0x30,iVar1);
      if (0 < (long)iVar1) {
        lVar6 = *(long *)(lVar5 + 8);
        lVar7 = 0;
        lVar8 = 0;
        do {
          pcVar2 = (this->m_contiguousNodes).m_data;
          lVar10 = 4;
          do {
            *(undefined4 *)(lVar6 + lVar10 * 4) =
                 *(undefined4 *)((long)(pcVar2->m_aabbMinOrg).m_floats + lVar10 * 4 + lVar7);
            lVar10 = lVar10 + 1;
          } while (lVar10 != 8);
          lVar10 = 0;
          do {
            *(undefined4 *)(lVar6 + lVar10 * 4) =
                 *(undefined4 *)((long)(pcVar2->m_aabbMinOrg).m_floats + lVar10 * 4 + lVar7);
            lVar10 = lVar10 + 1;
          } while (lVar10 != 4);
          lVar10 = lVar8 + 1;
          lVar7 = lVar7 + 0x40;
          *(undefined8 *)(lVar6 + 0x20) = *(undefined8 *)&pcVar2[lVar8].m_escapeIndex;
          *(int *)(lVar6 + 0x28) = pcVar2[lVar8].m_triangleIndex;
          *(undefined4 *)(lVar6 + 0x2c) = 0;
          lVar6 = lVar6 + 0x30;
          lVar8 = lVar10;
        } while (lVar10 != iVar1);
      }
      (**(code **)(*(long *)serializer + 0x28))
                (serializer,lVar5,"cbtOptimizedBvhNodeData",0x59415241,
                 (this->m_contiguousNodes).m_data);
    }
  }
  iVar1 = (this->m_quantizedContiguousNodes).m_size;
  *(int *)((long)dataBuffer + 0x3c) = iVar1;
  if (iVar1 == 0) {
    *(undefined8 *)((long)dataBuffer + 0x48) = 0;
  }
  else {
    lVar5 = (**(code **)(*(long *)serializer + 0x38))
                      (serializer,(this->m_quantizedContiguousNodes).m_data);
    *(long *)((long)dataBuffer + 0x48) = lVar5;
    if (lVar5 != 0) {
      iVar1 = (this->m_quantizedContiguousNodes).m_size;
      lVar5 = (**(code **)(*(long *)serializer + 0x20))(serializer,0x10,iVar1);
      pcVar3 = (this->m_quantizedContiguousNodes).m_data;
      if (0 < (long)iVar1) {
        lVar6 = *(long *)(lVar5 + 8);
        lVar8 = 0;
        do {
          *(undefined4 *)(lVar6 + 0xc + lVar8) =
               *(undefined4 *)((long)pcVar3->m_quantizedAabbMax + lVar8 + 6);
          *(undefined2 *)(lVar6 + 6 + lVar8) =
               *(undefined2 *)((long)pcVar3->m_quantizedAabbMax + lVar8);
          *(undefined2 *)(lVar6 + 8 + lVar8) =
               *(undefined2 *)((long)pcVar3->m_quantizedAabbMax + lVar8 + 2);
          *(undefined2 *)(lVar6 + 10 + lVar8) =
               *(undefined2 *)((long)pcVar3->m_quantizedAabbMax + lVar8 + 4);
          *(undefined2 *)(lVar6 + lVar8) = *(undefined2 *)((long)pcVar3->m_quantizedAabbMin + lVar8)
          ;
          *(undefined2 *)(lVar6 + 2 + lVar8) =
               *(undefined2 *)((long)pcVar3->m_quantizedAabbMin + lVar8 + 2);
          *(undefined2 *)(lVar6 + 4 + lVar8) =
               *(undefined2 *)((long)pcVar3->m_quantizedAabbMin + lVar8 + 4);
          lVar8 = lVar8 + 0x10;
        } while ((long)iVar1 * 0x10 != lVar8);
      }
      (**(code **)(*(long *)serializer + 0x28))
                (serializer,lVar5,"cbtQuantizedBvhNodeData",0x59415241);
    }
  }
  *(cbtTraversalMode *)((long)dataBuffer + 0x58) = this->m_traversalMode;
  iVar1 = (this->m_SubtreeHeaders).m_size;
  *(int *)((long)dataBuffer + 0x5c) = iVar1;
  if (iVar1 == 0) {
    *(undefined8 *)((long)dataBuffer + 0x50) = 0;
  }
  else {
    lVar5 = (**(code **)(*(long *)serializer + 0x38))(serializer,(this->m_SubtreeHeaders).m_data);
    *(long *)((long)dataBuffer + 0x50) = lVar5;
    if (lVar5 != 0) {
      iVar1 = (this->m_SubtreeHeaders).m_size;
      lVar5 = (**(code **)(*(long *)serializer + 0x20))(serializer,0x14,iVar1);
      if (0 < (long)iVar1) {
        lVar6 = *(long *)(lVar5 + 8);
        piVar9 = &((this->m_SubtreeHeaders).m_data)->m_rootNodeIndex;
        lVar8 = 0;
        do {
          *(unsigned_short *)(lVar6 + 0xe + lVar8) = *(unsigned_short *)((long)piVar9 + -6);
          *(unsigned_short *)(lVar6 + 0x10 + lVar8) = *(unsigned_short *)(piVar9 + -1);
          *(unsigned_short *)(lVar6 + 0x12 + lVar8) = *(unsigned_short *)((long)piVar9 + -2);
          *(unsigned_short *)(lVar6 + 8 + lVar8) =
               ((cbtBvhSubtreeInfo *)(piVar9 + -3))->m_quantizedAabbMin[0];
          *(unsigned_short *)(lVar6 + 10 + lVar8) = *(unsigned_short *)((long)piVar9 + -10);
          *(unsigned_short *)(lVar6 + 0xc + lVar8) = *(unsigned_short *)(piVar9 + -2);
          uVar4 = *(undefined8 *)piVar9;
          piVar9 = piVar9 + 8;
          *(undefined8 *)(lVar6 + lVar8) = uVar4;
          lVar8 = lVar8 + 0x14;
        } while ((long)iVar1 * 0x14 != lVar8);
      }
      (**(code **)(*(long *)serializer + 0x28))(serializer,lVar5,"cbtBvhSubtreeInfoData",0x59415241)
      ;
    }
  }
  return "cbtQuantizedBvhFloatData";
}

Assistant:

const char* cbtQuantizedBvh::serialize(void* dataBuffer, cbtSerializer* serializer) const
{
	cbtQuantizedBvhData* quantizedData = (cbtQuantizedBvhData*)dataBuffer;

	m_bvhAabbMax.serialize(quantizedData->m_bvhAabbMax);
	m_bvhAabbMin.serialize(quantizedData->m_bvhAabbMin);
	m_bvhQuantization.serialize(quantizedData->m_bvhQuantization);

	quantizedData->m_curNodeIndex = m_curNodeIndex;
	quantizedData->m_useQuantization = m_useQuantization;

	quantizedData->m_numContiguousLeafNodes = m_contiguousNodes.size();
	quantizedData->m_contiguousNodesPtr = (cbtOptimizedBvhNodeData*)(m_contiguousNodes.size() ? serializer->getUniquePointer((void*)&m_contiguousNodes[0]) : 0);
	if (quantizedData->m_contiguousNodesPtr)
	{
		int sz = sizeof(cbtOptimizedBvhNodeData);
		int numElem = m_contiguousNodes.size();
		cbtChunk* chunk = serializer->allocate(sz, numElem);
		cbtOptimizedBvhNodeData* memPtr = (cbtOptimizedBvhNodeData*)chunk->m_oldPtr;
		for (int i = 0; i < numElem; i++, memPtr++)
		{
			m_contiguousNodes[i].m_aabbMaxOrg.serialize(memPtr->m_aabbMaxOrg);
			m_contiguousNodes[i].m_aabbMinOrg.serialize(memPtr->m_aabbMinOrg);
			memPtr->m_escapeIndex = m_contiguousNodes[i].m_escapeIndex;
			memPtr->m_subPart = m_contiguousNodes[i].m_subPart;
			memPtr->m_triangleIndex = m_contiguousNodes[i].m_triangleIndex;
			// Fill padding with zeros to appease msan.
			memset(memPtr->m_pad, 0, sizeof(memPtr->m_pad));
		}
		serializer->finalizeChunk(chunk, "cbtOptimizedBvhNodeData", BT_ARRAY_CODE, (void*)&m_contiguousNodes[0]);
	}

	quantizedData->m_numQuantizedContiguousNodes = m_quantizedContiguousNodes.size();
	//	printf("quantizedData->m_numQuantizedContiguousNodes=%d\n",quantizedData->m_numQuantizedContiguousNodes);
	quantizedData->m_quantizedContiguousNodesPtr = (cbtQuantizedBvhNodeData*)(m_quantizedContiguousNodes.size() ? serializer->getUniquePointer((void*)&m_quantizedContiguousNodes[0]) : 0);
	if (quantizedData->m_quantizedContiguousNodesPtr)
	{
		int sz = sizeof(cbtQuantizedBvhNodeData);
		int numElem = m_quantizedContiguousNodes.size();
		cbtChunk* chunk = serializer->allocate(sz, numElem);
		cbtQuantizedBvhNodeData* memPtr = (cbtQuantizedBvhNodeData*)chunk->m_oldPtr;
		for (int i = 0; i < numElem; i++, memPtr++)
		{
			memPtr->m_escapeIndexOrTriangleIndex = m_quantizedContiguousNodes[i].m_escapeIndexOrTriangleIndex;
			memPtr->m_quantizedAabbMax[0] = m_quantizedContiguousNodes[i].m_quantizedAabbMax[0];
			memPtr->m_quantizedAabbMax[1] = m_quantizedContiguousNodes[i].m_quantizedAabbMax[1];
			memPtr->m_quantizedAabbMax[2] = m_quantizedContiguousNodes[i].m_quantizedAabbMax[2];
			memPtr->m_quantizedAabbMin[0] = m_quantizedContiguousNodes[i].m_quantizedAabbMin[0];
			memPtr->m_quantizedAabbMin[1] = m_quantizedContiguousNodes[i].m_quantizedAabbMin[1];
			memPtr->m_quantizedAabbMin[2] = m_quantizedContiguousNodes[i].m_quantizedAabbMin[2];
		}
		serializer->finalizeChunk(chunk, "cbtQuantizedBvhNodeData", BT_ARRAY_CODE, (void*)&m_quantizedContiguousNodes[0]);
	}

	quantizedData->m_traversalMode = int(m_traversalMode);
	quantizedData->m_numSubtreeHeaders = m_SubtreeHeaders.size();

	quantizedData->m_subTreeInfoPtr = (cbtBvhSubtreeInfoData*)(m_SubtreeHeaders.size() ? serializer->getUniquePointer((void*)&m_SubtreeHeaders[0]) : 0);
	if (quantizedData->m_subTreeInfoPtr)
	{
		int sz = sizeof(cbtBvhSubtreeInfoData);
		int numElem = m_SubtreeHeaders.size();
		cbtChunk* chunk = serializer->allocate(sz, numElem);
		cbtBvhSubtreeInfoData* memPtr = (cbtBvhSubtreeInfoData*)chunk->m_oldPtr;
		for (int i = 0; i < numElem; i++, memPtr++)
		{
			memPtr->m_quantizedAabbMax[0] = m_SubtreeHeaders[i].m_quantizedAabbMax[0];
			memPtr->m_quantizedAabbMax[1] = m_SubtreeHeaders[i].m_quantizedAabbMax[1];
			memPtr->m_quantizedAabbMax[2] = m_SubtreeHeaders[i].m_quantizedAabbMax[2];
			memPtr->m_quantizedAabbMin[0] = m_SubtreeHeaders[i].m_quantizedAabbMin[0];
			memPtr->m_quantizedAabbMin[1] = m_SubtreeHeaders[i].m_quantizedAabbMin[1];
			memPtr->m_quantizedAabbMin[2] = m_SubtreeHeaders[i].m_quantizedAabbMin[2];

			memPtr->m_rootNodeIndex = m_SubtreeHeaders[i].m_rootNodeIndex;
			memPtr->m_subtreeSize = m_SubtreeHeaders[i].m_subtreeSize;
		}
		serializer->finalizeChunk(chunk, "cbtBvhSubtreeInfoData", BT_ARRAY_CODE, (void*)&m_SubtreeHeaders[0]);
	}
	return cbtQuantizedBvhDataName;
}